

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmFormatter::buffer_rendered(CVmFormatter *this,wchar_t c,uchar flags,int wid)

{
  undefined4 uVar1;
  undefined4 uVar2;
  os_color_t oVar3;
  undefined4 uVar4;
  byte bVar5;
  int iVar6;
  
  iVar6 = this->linepos_;
  if (iVar6 < 1) {
    bVar5 = 0;
  }
  else {
    bVar5 = this->flagbuf_[iVar6 - 1] & 1;
  }
  while (wid != 0) {
    this->linebuf_[iVar6] = c;
    this->flagbuf_[this->linepos_] = flags;
    iVar6 = this->linepos_;
    uVar4 = *(undefined4 *)&(this->cur_color_).field_0x14;
    this->colorbuf_[iVar6].attr = (this->cur_color_).attr;
    *(undefined4 *)&this->colorbuf_[iVar6].field_0x14 = uVar4;
    oVar3 = (this->cur_color_).bg;
    this->colorbuf_[iVar6].fg = (this->cur_color_).fg;
    this->colorbuf_[iVar6].bg = oVar3;
    if (1 < wid) {
      this->flagbuf_[this->linepos_] = this->flagbuf_[this->linepos_] | bVar5;
    }
    uVar1 = this->linepos_;
    uVar2 = this->linecol_;
    iVar6 = uVar1 + 1;
    this->linepos_ = iVar6;
    this->linecol_ = uVar2 + 1;
    wid = wid + -1;
  }
  return;
}

Assistant:

void CVmFormatter::buffer_rendered(wchar_t c, unsigned char flags, int wid)
{
    unsigned char flags_before;

    /* note whether or not we have a break before us */
    flags_before = (linepos_ > 0
                    ? flagbuf_[linepos_-1] & VMCON_OBF_NOBREAK
                    : 0);

    /* add the character the given number of times */
    for ( ; wid != 0 ; --wid)
    {
        /* buffer the character */
        linebuf_[linepos_] = c;
        flagbuf_[linepos_] = flags;
        colorbuf_[linepos_] = cur_color_;

        /* 
         *   if this isn't the last part of the character, carry forward any
         *   no-break flag from the previous part of the character; this will
         *   ensure that a no-break to the left of the sequence applies to
         *   the entire sequence 
         */
        if (wid > 1)
            flagbuf_[linepos_] |= flags_before;

        /* advance one character in the buffer */
        ++linepos_;

        /* adjust our column counter */
        ++linecol_;
    }
}